

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindLeastGreatest<duckdb::GreaterOp>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  optional_idx error_location;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var1;
  bool bVar2;
  reference pvVar3;
  type pEVar4;
  ParameterNotResolvedException *this_00;
  reference pvVar5;
  BinderException *this_01;
  pointer pEVar6;
  size_type __n;
  code *__f;
  LogicalType arg_type;
  LogicalType local_e0;
  string local_c8;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_90;
  LogicalType local_88;
  string local_70;
  string local_50;
  
  local_90._M_head_impl = (FunctionData *)this;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar3);
  ExpressionBinder::GetExpressionReturnType(&local_e0,pEVar4);
  if (8 < (ulong)((long)(arguments->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(arguments->
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    __n = 1;
    do {
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,__n);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar3);
      ExpressionBinder::GetExpressionReturnType(&local_88,pEVar4);
      bVar2 = LogicalType::TryGetMaxLogicalType(context,&local_e0,&local_88,&local_e0);
      if (!bVar2) {
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,__n);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar3);
        error_location.index = (pEVar6->super_BaseExpression).query_location.index;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,
                   "Cannot combine types of %s and %s - an explicit cast is required","");
        LogicalType::ToString_abi_cxx11_(&local_50,&local_e0);
        LogicalType::ToString_abi_cxx11_(&local_70,&local_88);
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  (this_01,error_location,&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LogicalType::~LogicalType(&local_88);
      __n = __n + 1;
    } while (__n < (ulong)((long)(arguments->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(arguments->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_e0.id_ == STRING_LITERAL) {
    LogicalType::LogicalType((LogicalType *)&local_c8,VARCHAR);
LAB_01bc8272:
    local_e0.id_ = (LogicalTypeId)local_c8._M_dataplus._M_p;
    local_e0.physical_type_ = local_c8._M_dataplus._M_p._1_1_;
    LogicalType::~LogicalType((LogicalType *)&local_c8);
  }
  else {
    if (local_e0.id_ == INTEGER_LITERAL) {
      IntegerLiteral::GetType((LogicalType *)&local_c8,&local_e0);
      goto LAB_01bc8272;
    }
    if (local_e0.id_ == UNKNOWN) {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  switch(local_e0.physical_type_) {
  case BOOL:
  case INT8:
    __f = 
    LeastGreatestFunction<signed_char,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case UINT64|UINT8:
  case FLOAT:
switchD_01bc82ea_caseD_2:
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
               &bound_function->function,
               LeastGreatestFunction<duckdb::string_t,duckdb::GreaterThan,duckdb::SortKeyLeastGreatest>
              );
    bound_function->init_local_state = LeastGreatestSortKeyInit<duckdb::GreaterOp>;
    goto LAB_01bc8393;
  case INT16:
    __f = LeastGreatestFunction<short,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case INT32:
    __f = LeastGreatestFunction<int,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case INT64:
    __f = LeastGreatestFunction<long,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>;
    break;
  case DOUBLE:
    __f = LeastGreatestFunction<double,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>;
    break;
  default:
    if (local_e0.physical_type_ == VARCHAR) {
      __f = 
      LeastGreatestFunction<duckdb::string_t,duckdb::GreaterThan,duckdb::StandardLeastGreatest<true>>
      ;
    }
    else {
      if (local_e0.physical_type_ != INT128) goto switchD_01bc82ea_caseD_2;
      __f = 
      LeastGreatestFunction<duckdb::hugeint_t,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>
      ;
    }
  }
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             &bound_function->function,__f);
LAB_01bc8393:
  pvVar5 = vector<duckdb::LogicalType,_true>::operator[]
                     (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  if (pvVar5 != &local_e0) {
    pvVar5->id_ = local_e0.id_;
    pvVar5->physical_type_ = local_e0.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar5->type_info_,&local_e0.type_info_);
  }
  if (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs != &local_e0) {
    (bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs.id_ = local_e0.id_;
    (bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs.physical_type_ =
         local_e0.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_,
               &local_e0.type_info_);
  }
  if (&(bound_function->super_BaseScalarFunction).return_type != &local_e0) {
    (bound_function->super_BaseScalarFunction).return_type.id_ = local_e0.id_;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ = local_e0.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
               &local_e0.type_info_);
  }
  _Var1._M_head_impl = local_90._M_head_impl;
  (local_90._M_head_impl)->_vptr_FunctionData = (_func_int **)0x0;
  LogicalType::~LogicalType(&local_e0);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         _Var1._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> BindLeastGreatest(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {
	LogicalType child_type = ExpressionBinder::GetExpressionReturnType(*arguments[0]);
	for (idx_t i = 1; i < arguments.size(); i++) {
		auto arg_type = ExpressionBinder::GetExpressionReturnType(*arguments[i]);
		if (!LogicalType::TryGetMaxLogicalType(context, child_type, arg_type, child_type)) {
			throw BinderException(arguments[i]->GetQueryLocation(),
			                      "Cannot combine types of %s and %s - an explicit cast is required",
			                      child_type.ToString(), arg_type.ToString());
		}
	}
	switch (child_type.id()) {
	case LogicalTypeId::UNKNOWN:
		throw ParameterNotResolvedException();
	case LogicalTypeId::INTEGER_LITERAL:
		child_type = IntegerLiteral::GetType(child_type);
		break;
	case LogicalTypeId::STRING_LITERAL:
		child_type = LogicalType::VARCHAR;
		break;
	default:
		break;
	}
	using OP = typename LEAST_GREATER_OP::OP;
	switch (child_type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		bound_function.function = LeastGreatestFunction<int8_t, OP>;
		break;
	case PhysicalType::INT16:
		bound_function.function = LeastGreatestFunction<int16_t, OP>;
		break;
	case PhysicalType::INT32:
		bound_function.function = LeastGreatestFunction<int32_t, OP>;
		break;
	case PhysicalType::INT64:
		bound_function.function = LeastGreatestFunction<int64_t, OP>;
		break;
	case PhysicalType::INT128:
		bound_function.function = LeastGreatestFunction<hugeint_t, OP>;
		break;
	case PhysicalType::DOUBLE:
		bound_function.function = LeastGreatestFunction<double, OP>;
		break;
	case PhysicalType::VARCHAR:
		bound_function.function = LeastGreatestFunction<string_t, OP, StandardLeastGreatest<true>>;
		break;
#endif
	default:
		// fallback with sort keys
		bound_function.function = LeastGreatestFunction<string_t, OP, SortKeyLeastGreatest>;
		bound_function.init_local_state = LeastGreatestSortKeyInit<LEAST_GREATER_OP>;
		break;
	}
	bound_function.arguments[0] = child_type;
	bound_function.varargs = child_type;
	bound_function.return_type = child_type;
	return nullptr;
}